

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManArePrintUsed_rec(Gia_ManAre_t *p,Gia_PtrAre_t Root,int fTree)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_ObjAre_t *q;
  Gia_ObjAre_t *pObj;
  int fTree_local;
  Gia_ManAre_t *p_local;
  Gia_PtrAre_t Root_local;
  
  if (fTree == 0) {
    p_local._4_4_ = Gia_ManArePrintListUsed(p,Root);
  }
  else {
    q = Gia_ManAreObj(p,Root);
    iVar1 = Gia_ObjHasBranch0(q);
    iVar1 = Gia_ManArePrintUsed_rec(p,q->F[0],iVar1);
    iVar2 = Gia_ObjHasBranch1(q);
    iVar2 = Gia_ManArePrintUsed_rec(p,q->F[1],iVar2);
    iVar3 = Gia_ObjHasBranch2(q);
    iVar3 = Gia_ManArePrintUsed_rec(p,q->F[2],iVar3);
    p_local._4_4_ = iVar1 + iVar2 + iVar3;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManArePrintUsed_rec( Gia_ManAre_t * p, Gia_PtrAre_t Root, int fTree )
{
    Gia_ObjAre_t * pObj;
    if ( !fTree )
        return Gia_ManArePrintListUsed( p, Root );
    pObj = Gia_ManAreObj(p, Root);
    return Gia_ManArePrintUsed_rec( p, pObj->F[0], Gia_ObjHasBranch0(pObj) ) +
           Gia_ManArePrintUsed_rec( p, pObj->F[1], Gia_ObjHasBranch1(pObj) ) +
           Gia_ManArePrintUsed_rec( p, pObj->F[2], Gia_ObjHasBranch2(pObj) );
}